

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall OutputStream::writeVaruint(OutputStream *this,uint64_t v)

{
  byte bVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  undefined8 local_10;
  
  for (local_10 = in_RSI; 0x7f < local_10; local_10 = local_10 >> 7) {
    bVar1 = (byte)local_10 & 0x7f | 0x80;
    (**(code **)*in_RDI)(in_RDI,bVar1,in_RDX,bVar1);
    in_RDX = extraout_RDX;
  }
  (**(code **)*in_RDI)(in_RDI,local_10 & 0xff,in_RDX,(byte)local_10);
  return;
}

Assistant:

void OutputStream::writeVaruint(uint64_t v) {

  while (v > 0x7F) {
    writeByte(0x80 | uint8_t(v & 0x7F));
    v >>= 7;
  }

  writeByte(uint8_t(v));
}